

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.hpp
# Opt level: O2

void __thiscall WorkSpace::~WorkSpace(WorkSpace *this)

{
  std::vector<JournalOperation,_std::allocator<JournalOperation>_>::~vector
            ((vector<JournalOperation,_std::allocator<JournalOperation>_> *)(this + 0x168));
  std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::~vector
            ((vector<DistanceGraph,_std::allocator<DistanceGraph>_> *)(this + 0x150));
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::~vector
            ((vector<KmerCounter,_std::allocator<KmerCounter>_> *)(this + 0x138));
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::~vector
            ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)(this + 0x120));
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::~vector
            ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)(this + 0x108));
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::~vector
            ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)(this + 0xf0));
  SequenceDistanceGraph::~SequenceDistanceGraph((SequenceDistanceGraph *)this);
  return;
}

Assistant:

WorkSpace(const WorkSpace& that) = delete;